

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall geemuboi::core::CPU::adc_a_mhl(CPU *this)

{
  uint8_t *puVar1;
  ushort uVar2;
  Registers *pRVar3;
  Registers *pRVar4;
  uint uVar5;
  uint uVar6;
  
  pRVar3 = this->regs;
  uVar2._0_1_ = pRVar3->h;
  uVar2._1_1_ = pRVar3->l;
  uVar5 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)(ushort)(uVar2 << 8 | uVar2 >> 8));
  pRVar4 = this->regs;
  uVar6 = pRVar4->f >> 4 & 1;
  pRVar4->f = '\0';
  if (0xf < (pRVar3->a & 0xf) + uVar6 + (uVar5 & 0xf)) {
    pRVar4->f = ' ';
  }
  if (0xff < (uVar5 & 0xff) + uVar6 + (uint)pRVar3->a) {
    pRVar4->f = pRVar4->f | 0x10;
  }
  pRVar3->a = pRVar3->a + (char)uVar5 + (char)uVar6;
  if (pRVar3->a == '\0') {
    puVar1 = &this->regs->f;
    *puVar1 = *puVar1 | 0x80;
  }
  return 2;
}

Assistant:

int CPU::adc_a_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    adc_r8_r8(regs.a, mmu.read_byte(addr));
    return 2;
}